

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_ctx.c
# Opt level: O0

BIGNUM * BN_CTX_get(BN_CTX *ctx)

{
  BIO *trc_out_1;
  BIO *trc_out;
  BIGNUM *ret;
  char *func;
  BN_POOL *in_stack_fffffffffffffff8;
  BIGNUM *a;
  
  func = (char *)0x0;
  if ((*(int *)(ctx + 0x34) == 0) && (*(int *)(ctx + 0x38) == 0)) {
    a = BN_POOL_get(in_stack_fffffffffffffff8,(int)((ulong)ctx >> 0x20));
    if (a == (BIGNUM *)0x0) {
      *(undefined4 *)(ctx + 0x38) = 1;
      ERR_new();
      ERR_set_debug((char *)ctx,(int)((ulong)a >> 0x20),func);
      ERR_set_error(3,0x6d,(char *)0x0);
      a = (BIGNUM *)0x0;
    }
    else {
      BN_zero_ex(a);
      a->flags = a->flags & 0xfffffffb;
      *(int *)(ctx + 0x30) = *(int *)(ctx + 0x30) + 1;
    }
  }
  else {
    a = (BIGNUM *)0x0;
  }
  return (BIGNUM *)a;
}

Assistant:

BIGNUM *BN_CTX_get(BN_CTX *ctx)
{
    BIGNUM *ret;

    CTXDBG("ENTER BN_CTX_get()", ctx);
    if (ctx->err_stack || ctx->too_many)
        return NULL;
    if ((ret = BN_POOL_get(&ctx->pool, ctx->flags)) == NULL) {
        /*
         * Setting too_many prevents repeated "get" attempts from cluttering
         * the error stack.
         */
        ctx->too_many = 1;
        ERR_raise(ERR_LIB_BN, BN_R_TOO_MANY_TEMPORARY_VARIABLES);
        return NULL;
    }
    /* OK, make sure the returned bignum is "zero" */
    BN_zero(ret);
    /* clear BN_FLG_CONSTTIME if leaked from previous frames */
    ret->flags &= (~BN_FLG_CONSTTIME);
    ctx->used++;
    CTXDBG("LEAVE BN_CTX_get()", ctx);
    return ret;
}